

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLint __thiscall
gl4cts::GLSL420Pack::Utils::program::getUniformLocation(program *this,GLchar *uniform_name)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  TestError *this_02;
  MessageBuilder local_1a8;
  int local_24;
  long lStack_20;
  GLint location;
  Functions *gl;
  GLchar *uniform_name_local;
  program *this_local;
  
  gl = (Functions *)uniform_name;
  uniform_name_local = (GLchar *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0xffffffff;
  local_24 = (**(code **)(lStack_20 + 0xb48))(this->m_program_object_id,gl);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x46fd);
  if (local_24 == -1) {
    this_00 = deqp::Context::getTestContext(this->m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [10])"Uniform: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])0x2a18143);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x4704);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_24;
}

Assistant:

GLint Utils::program::getUniformLocation(const glw::GLchar* uniform_name) const
{
	const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
	GLint				  location = -1;

	location = gl.getUniformLocation(m_program_object_id, uniform_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == location)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Uniform: " << uniform_name
											<< " is not available" << tcu::TestLog::EndMessage;

		TCU_FAIL("Uniform is not available");
	}

	return location;
}